

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O1

void __thiscall cppjieba::SegmentBase::SegmentBase(SegmentBase *this)

{
  bool bVar1;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [368];
  
  this->_vptr_SegmentBase = (_func_int **)&PTR__SegmentBase_00124c80;
  (this->symbols_)._M_h._M_buckets = &(this->symbols_)._M_h._M_single_bucket;
  (this->symbols_)._M_h._M_bucket_count = 1;
  (this->symbols_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols_)._M_h._M_element_count = 0;
  (this->symbols_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1a0[0] = &((Logger *)local_1a0)->field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,anon_var_dwarf_22c95,anon_var_dwarf_22c95 + 9);
  bVar1 = ResetSeparators(this,(string *)local_1a0);
  if (local_1a0[0] != &((Logger *)local_1a0)->field_0x10) {
    operator_delete(local_1a0[0]);
  }
  if (!bVar1) {
    limonp::Logger::Logger
              ((Logger *)local_1a0,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/SegmentBase.hpp"
               ,0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"exp: [ResetSeparators(SPECIAL_SEPARATORS)",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_1a0);
  }
  return;
}

Assistant:

SegmentBase() {
    XCHECK(ResetSeparators(SPECIAL_SEPARATORS));
  }